

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O1

UBool __thiscall icu_63::RegexPattern::operator==(RegexPattern *this,RegexPattern *other)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *this_00;
  UnicodeString *text;
  UText *pUVar3;
  long lVar4;
  UBool UVar5;
  int32_t len;
  int32_t iVar6;
  
  if ((this->fFlags == other->fFlags) && (this->fDeferredStatus == other->fDeferredStatus)) {
    this_00 = this->fPatternString;
    if ((this_00 != (UnicodeString *)0x0) &&
       (text = other->fPatternString, text != (UnicodeString *)0x0)) {
      uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) != 0) {
        return *(byte *)&text->fUnion & 1;
      }
      if ((short)uVar1 < 0) {
        len = (this_00->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar6 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return '\0';
      }
      if (len != iVar6) {
        return '\0';
      }
      UVar5 = icu_63::UnicodeString::doEquals(this_00,text,len);
      return UVar5 != '\0';
    }
    pUVar3 = this->fPattern;
    if (pUVar3 == (UText *)0x0) {
      if (other->fPattern == (UText *)0x0) {
        return '\x01';
      }
    }
    else if (other->fPattern != (UText *)0x0) {
      lVar4 = pUVar3->chunkNativeStart;
      if (((lVar4 < 1) && (-lVar4 < (long)pUVar3->nativeIndexingLimit)) &&
         ((ushort)pUVar3->chunkContents[-lVar4] < 0xdc00)) {
        pUVar3->chunkOffset = (int32_t)-lVar4;
      }
      else {
        utext_setNativeIndex_63(pUVar3,0);
      }
      pUVar3 = other->fPattern;
      lVar4 = pUVar3->chunkNativeStart;
      if (((lVar4 < 1) && (-lVar4 < (long)pUVar3->nativeIndexingLimit)) &&
         ((ushort)pUVar3->chunkContents[-lVar4] < 0xdc00)) {
        pUVar3->chunkOffset = (int32_t)-lVar4;
      }
      else {
        utext_setNativeIndex_63(pUVar3,0);
      }
      UVar5 = utext_equals_63(this->fPattern,other->fPattern);
      return UVar5;
    }
  }
  return '\0';
}

Assistant:

UBool   RegexPattern::operator ==(const RegexPattern &other) const {
    if (this->fFlags == other.fFlags && this->fDeferredStatus == other.fDeferredStatus) {
        if (this->fPatternString != NULL && other.fPatternString != NULL) {
            return *(this->fPatternString) == *(other.fPatternString);
        } else if (this->fPattern == NULL) {
            if (other.fPattern == NULL) {
                return TRUE;
            }
        } else if (other.fPattern != NULL) {
            UTEXT_SETNATIVEINDEX(this->fPattern, 0);
            UTEXT_SETNATIVEINDEX(other.fPattern, 0);
            return utext_equals(this->fPattern, other.fPattern);
        }
    }
    return FALSE;
}